

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegularExpression.cpp
# Opt level: O3

int xercesc_4_0::RegularExpression::getOptionValue(XMLCh ch)

{
  int iVar1;
  undefined2 in_register_0000003a;
  int iVar2;
  
  iVar2 = CONCAT22(in_register_0000003a,ch);
  iVar1 = 0;
  if (iVar2 < 0x69) {
    if (iVar2 == 0x46) {
      return 0x100;
    }
    if (iVar2 == 0x48) {
      iVar1 = 0x80;
    }
    else if (iVar2 == 0x58) {
      return 0x200;
    }
  }
  else if (iVar2 < 0x73) {
    if (iVar2 == 0x69) {
      return 2;
    }
    if (iVar2 == 0x6d) {
      return 8;
    }
  }
  else {
    if (iVar2 == 0x73) {
      return 4;
    }
    if (iVar2 == 0x78) {
      return 0x10;
    }
  }
  return iVar1;
}

Assistant:

int RegularExpression::getOptionValue(const XMLCh ch) {

    int ret = 0;

    switch (ch) {

        case chLatin_i:
            ret = IGNORE_CASE;
            break;
        case chLatin_m:
            ret = MULTIPLE_LINE;
            break;
        case chLatin_s:
            ret = SINGLE_LINE;
            break;
        case chLatin_x:
            ret = EXTENDED_COMMENT;
            break;
        case chLatin_F:
            ret = PROHIBIT_FIXED_STRING_OPTIMIZATION;
            break;
        case chLatin_H:
            ret = PROHIBIT_HEAD_CHARACTER_OPTIMIZATION;
            break;
        case chLatin_X:
            ret = XMLSCHEMA_MODE;
            break;
        default:
            break;
    }

    return ret;
}